

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTest.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool *pbVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  XMLGrammarPoolImpl *this;
  ulong uVar4;
  ThreadParser *this_00;
  ulong uVar5;
  ThreadInfo *pTVar6;
  bool bVar7;
  char *pcVar8;
  int *piVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  
  parseCommandLine(argc,argv);
  uVar5 = 0;
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  if (((gRunInfo.doSchema == true) && (gRunInfo.doNamespaces == true)) &&
     (gRunInfo.doGrammarCaching == true)) {
    gpMemMgr = (MemoryManager *)operator_new(8);
    gpMemMgr->_vptr_MemoryManager =
         (_func_int **)&xercesc_4_0::XMLUni::fgXercesHandleMultipleImports;
    this = (XMLGrammarPoolImpl *)xercesc_4_0::XMemory::operator_new((XMemory *)0x40,uVar5);
    xercesc_4_0::XMLGrammarPoolImpl::XMLGrammarPoolImpl(this,gpMemMgr);
    gRunInfo.doInitialParse = true;
    gp = (XMLGrammarPool *)this;
  }
  ReadFilesIntoMemory();
  uVar4 = 0;
  uVar5 = (ulong)(uint)gRunInfo.numInputFiles;
  if (gRunInfo.numInputFiles < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 * 0x28 - uVar4 != 0; uVar4 = uVar4 + 0x28) {
    *(undefined4 *)((long)&gRunInfo.files[0].checkSum + uVar4) = 0;
  }
  if (gRunInfo.doInitialParse != false) {
    this_00 = (ThreadParser *)operator_new(0x40);
    ThreadParser::ThreadParser(this_00);
    piVar9 = &gRunInfo.files[0].checkSum;
    bVar7 = false;
    for (lVar10 = 0; lVar10 < gRunInfo.numInputFiles; lVar10 = lVar10 + 1) {
      pcVar8 = ((InFileInfo *)(piVar9 + -8))->fileName;
      if (gRunInfo.verbose == true) {
        printf("%s checksum is ",pcVar8);
      }
      uVar3 = ThreadParser::parse(this_00,(int)lVar10);
      if (uVar3 == 0) {
        fprintf(_stderr,"An error occurred while initially parsing %s\n",pcVar8);
        bVar7 = true;
      }
      *piVar9 = uVar3;
      if (gRunInfo.verbose == true) {
        printf("%x\n",(ulong)uVar3);
      }
      if (((gRunInfo.dumpOnErr == true) && (bVar7)) && (gRunInfo.dom == true)) {
        ThreadParser::domPrint(this_00);
      }
      piVar9 = piVar9 + 10;
    }
    ThreadParser::~ThreadParser(this_00);
    operator_delete(this_00,0x40);
    if (bVar7) {
      fwrite("Quitting due to error incurred during initial parse\n",0x34,1,_stderr);
      clearFileInfoMemory();
      return 1;
    }
  }
  uVar5 = (ulong)gRunInfo.numThreads;
  if (uVar5 == 0) {
    clearFileInfoMemory();
    exit(0);
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar5;
  uVar4 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0xc),8) == 0) {
    uVar4 = SUB168(auVar2 * ZEXT816(0xc),0);
  }
  gThreadInfo = (ThreadInfo *)operator_new__(uVar4);
  pTVar6 = gThreadInfo;
  do {
    pTVar6->fHeartBeat = false;
    pTVar6->fInProgress = false;
    pTVar6->fParses = 0;
    pTVar6->fThreadNum = -1;
    pTVar6 = pTVar6 + 1;
  } while (pTVar6 != gThreadInfo + uVar5);
  lVar11 = 0;
  for (lVar10 = 0; pTVar6 = gThreadInfo, lVar10 < (int)uVar5; lVar10 = lVar10 + 1) {
    *(int *)((long)&gThreadInfo->fThreadNum + lVar11) = (int)lVar10;
    ThreadFuncs::startThread(threadMain,&pTVar6->fHeartBeat + lVar11);
    uVar5 = (ulong)(uint)gRunInfo.numThreads;
    lVar11 = lVar11 + 0xc;
  }
  if (gRunInfo.numParses != 0) {
    do {
      sleep(1);
      uVar4 = 0;
      uVar5 = (ulong)(uint)gRunInfo.numThreads;
      if (gRunInfo.numThreads < 1) {
        uVar5 = uVar4;
      }
      bVar7 = false;
      for (; uVar5 * 0xc - uVar4 != 0; uVar4 = uVar4 + 0xc) {
        if (*(uint *)((long)&gThreadInfo->fParses + uVar4) < gRunInfo.numParses) {
          bVar7 = true;
        }
      }
    } while (bVar7);
LAB_00105d3f:
    gRunInfo.stopNow = true;
    for (uVar5 = 0; (long)uVar5 < (long)gRunInfo.numThreads; uVar5 = uVar5 + 1) {
      while (gThreadInfo[uVar5].fInProgress == true) {
        sleep(1);
      }
      if (gRunInfo.verbose == true) {
        printf("Thread #%d: is finished.\n",uVar5 & 0xffffffff);
      }
    }
    uVar4 = 0;
    uVar5 = (ulong)(uint)gRunInfo.numThreads;
    if (gRunInfo.numThreads < 1) {
      uVar5 = uVar4;
    }
    dVar12 = 0.0;
    for (; uVar5 * 0xc - uVar4 != 0; uVar4 = uVar4 + 0xc) {
      dVar12 = dVar12 + (double)*(uint *)((long)&gThreadInfo->fParses + uVar4);
    }
    if (gRunInfo.quiet == false) {
      if (gRunInfo.numParses == 0) {
        dVar12 = dVar12 / ((double)gRunInfo.totalTime / 60.0);
        pcVar8 = "\n%8.2f parses per minute.\n";
      }
      else {
        pcVar8 = "\n%8.0f total parses were completed.\n";
      }
      printf(pcVar8,dVar12);
    }
    if ((gp != (XMLGrammarPool *)0x0) &&
       ((**(code **)(*(long *)gp + 8))(), gpMemMgr != (MemoryManager *)0x0)) {
      (*gpMemMgr->_vptr_MemoryManager[1])();
    }
    xercesc_4_0::XMLPlatformUtils::Terminate();
    clearFileInfoMemory();
    if (gThreadInfo != (ThreadInfo *)0x0) {
      operator_delete__(gThreadInfo);
    }
    puts("Test Run Successfully");
    return 0;
  }
  lVar10 = xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
  uVar5 = 0;
LAB_00105e0a:
  if ((gRunInfo.totalTime == 0) || ((int)uVar5 < gRunInfo.totalTime)) {
    sleep(1);
    if (gRunInfo.verbose == false && gRunInfo.quiet == false) {
      uVar5 = (ulong)(uint)gRunInfo.numThreads;
      if (gRunInfo.numThreads < 1) {
        uVar5 = 0;
      }
      lVar11 = 0;
LAB_00105e4e:
      if (uVar5 * 0xc + 0xc != lVar11 + 0xc) goto code_r0x00105e57;
      fputc(0x2b,_stdout);
      fflush(_stdout);
      pTVar6 = gThreadInfo;
      uVar5 = (ulong)(uint)gRunInfo.numThreads;
      if (gRunInfo.numThreads < 1) {
        uVar5 = 0;
      }
      for (lVar11 = 0; uVar5 * 0xc - lVar11 != 0; lVar11 = lVar11 + 0xc) {
        (&pTVar6->fHeartBeat)[lVar11] = false;
      }
    }
    goto LAB_00105e75;
  }
  goto LAB_00105d3f;
code_r0x00105e57:
  pbVar1 = &gThreadInfo->fHeartBeat + lVar11;
  lVar11 = lVar11 + 0xc;
  if (*pbVar1 == false) goto code_r0x00105e60;
  goto LAB_00105e4e;
code_r0x00105e60:
  fputc(0x2e,_stdout);
  fflush(_stdout);
LAB_00105e75:
  lVar11 = xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
  uVar5 = (ulong)(lVar11 - lVar10) / 1000;
  goto LAB_00105e0a;
}

Assistant:

int main (int argc, char **argv)
{


    parseCommandLine(argc, argv);

    //
    // Initialize the XML system.
    //
    try
    {
         XMLPlatformUtils::Initialize();
    }
    catch (...)
    {
        fprintf(stderr, "Exception from XMLPlatfromUtils::Initialize.\n");
        return 1;
    }


    /** Grammar caching thread testing */
    // Initialize memory manger and grammar pool
    // set doInitialParse to true so that the first parse will cache the
    // grammar and it'll be used in subsequent parses

    if (gRunInfo.doSchema == true && gRunInfo.doNamespaces == true && gRunInfo.doGrammarCaching == true) {
        gpMemMgr = new MemoryManagerImpl();
        gp = new XMLGrammarPoolImpl(gpMemMgr);
        gRunInfo.doInitialParse = true;
    }

    //
    // If we will be parsing from memory, read each of the input files
    //  into memory now.
    //
    ReadFilesIntoMemory();

    // Initialize checksums to zero so we can check first parse and if
    // zero then we need to move first parse's checksum into array. This
    // is for the cse where we skip the initial parse.
    for (int n = 0; n < gRunInfo.numInputFiles; n++)
    {
        gRunInfo.files[n].checkSum = 0;
    }

    if (gRunInfo.doInitialParse)
    {
    //
    // While we are still single threaded, parse each of the documents
    // once, to check for errors, and to note the checksum.
    // Blow off the rest of the test if there are errors.
    //
        ThreadParser *mainParser = new ThreadParser;
        int     n;
        bool    errors = false;
        int     cksum;

        for (n = 0; n < gRunInfo.numInputFiles; n++)
        {
            char *fileName = gRunInfo.files[n].fileName;
            if (gRunInfo.verbose)
                printf("%s checksum is ", fileName);

            cksum = mainParser->parse(n);

            if (cksum == 0) {
                fprintf(stderr, "An error occurred while initially parsing %s\n",
                    fileName);
                errors = true;
            };

            gRunInfo.files[n].checkSum = cksum;
            if (gRunInfo.verbose )
                printf("%x\n", cksum);
            if (gRunInfo.dumpOnErr && errors && gRunInfo.dom) {
                mainParser->domPrint();
            }

        }
        delete mainParser;

        if (errors) {
            fprintf(stderr, "Quitting due to error incurred during initial parse\n");
            clearFileInfoMemory();
            return 1;
        }
    }

    //
    //  Fire off the requested number of parallel threads
    //

    if (gRunInfo.numThreads == 0) {
        clearFileInfoMemory();
        exit(0);
    }

    gThreadInfo = new ThreadInfo[gRunInfo.numThreads];

    int threadNum;
    for (threadNum=0; threadNum < gRunInfo.numThreads; threadNum++)
    {
        gThreadInfo[threadNum].fThreadNum = threadNum;
        ThreadFuncs::startThread(threadMain, &gThreadInfo[threadNum]);
    }

    if (gRunInfo.numParses)
    {
        bool notDone;
        while (true)
        {
            ThreadFuncs::Sleep(1000);
            notDone = false;

            for (threadNum = 0; threadNum < gRunInfo.numThreads; threadNum++) {
                if (gThreadInfo[threadNum].fParses < gRunInfo.numParses)
                    notDone = true;
            }
            if (notDone == false) {
                break;
            }
        }
    }
    else
    {
        //
        //  Loop, watching the heartbeat of the worker threads.
        //    Each second, display "+" when all threads have completed a parse
        //                 display "." if some thread hasn't since previous "+"
        //

        unsigned long startTime = XMLPlatformUtils::getCurrentMillis();
        int elapsedSeconds = 0;
        while (gRunInfo.totalTime == 0 || gRunInfo.totalTime > elapsedSeconds) {
            ThreadFuncs::Sleep(1000);
            if (gRunInfo.quiet == false && gRunInfo.verbose == false) {
                char c = '+';
                for (threadNum=0; threadNum < gRunInfo.numThreads; threadNum++) {
                    if (gThreadInfo[threadNum].fHeartBeat == false) {
                        c = '.';
                        break;
                    }
                }
                fputc(c, stdout);
                fflush(stdout);
                if (c == '+')
                    for (threadNum=0; threadNum < gRunInfo.numThreads; threadNum++)
                        gThreadInfo[threadNum].fHeartBeat = false;
            }
            elapsedSeconds = (XMLPlatformUtils::getCurrentMillis() - startTime) / 1000;
        }
    }

    //
    //  Time's up, we are done.  (We only get here if this was a timed run)
    //  Tally up the total number of parses completed by each of the threads.
    //
    gRunInfo.stopNow = true;      // set flag, which will cause worker threads to stop.

    //
    //  Make sure all threads are done before terminate
    //
    for (threadNum=0; threadNum < gRunInfo.numThreads; threadNum++) {
        while (gThreadInfo[threadNum].fInProgress == true) {
            ThreadFuncs::Sleep(1000);
        }
        if (gRunInfo.verbose)
            printf("Thread #%d: is finished.\n", threadNum);
    }

    //
    //  We are done!   Count the number of parse and terminate the program
    //
    double totalParsesCompleted = 0;
    for (threadNum=0; threadNum < gRunInfo.numThreads; threadNum++)
    {
        totalParsesCompleted += gThreadInfo[threadNum].fParses;
        // printf("%f   ", totalParsesCompleted);
    }

    if (gRunInfo.quiet == false) {
        if (gRunInfo.numParses) {
            printf("\n%8.0f total parses were completed.\n", totalParsesCompleted);
        }
        else {
            double parsesPerMinute = totalParsesCompleted / (double(gRunInfo.totalTime) / double(60));
            printf("\n%8.2f parses per minute.\n", parsesPerMinute);
        }
    }

    // delete grammar pool and memory manager
    if (gp) {
        delete gp;
        delete gpMemMgr;
    }

    XMLPlatformUtils::Terminate();

    clearFileInfoMemory();

    delete [] gThreadInfo;

    printf("Test Run Successfully\n");

    return 0;
}